

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

var __thiscall
cs::domain_manager::get_var_optimizable<cs::var_id_const&>(domain_manager *this,var_id *name)

{
  size_t sVar1;
  var *pvVar2;
  proxy *ppVar3;
  var_id *in_RDX;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar4 = *(long *)((long)&(name->m_id).field_2 + 8) - (name->m_id).field_2._M_allocated_capacity;
  lVar5 = (lVar4 >> 5) * -0x5555555555555555;
  if (lVar5 + ((long)((long)(name->m_ref).
                            super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                     name->m_slot_id) >> 4) * 0x5555555555555555 == 0 && lVar4 != 0) {
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    lVar4 = 0x60;
    lVar6 = -0x30;
    do {
      sVar1 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::count<std::__cxx11::string>
                        ((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)((long)&((name->m_ref).
                                     super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->domain + lVar6),&in_RDX->m_id);
      if (sVar1 != 0) {
        sVar1 = phmap::priv::
                raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                ::count<std::__cxx11::string>
                          ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                            *)(*(long *)((long)&(name->m_id).field_2 + 8) - lVar4),&in_RDX->m_id);
        if (sVar1 != 0) {
          pvVar2 = domain_type::get_var_no_check
                             ((domain_type *)(*(long *)((long)&(name->m_id).field_2 + 8) - lVar4),
                              in_RDX);
          ppVar3 = pvVar2->mDat;
          if (ppVar3 != (proxy *)0x0) {
            ppVar3->refcount = ppVar3->refcount + 1;
          }
          goto LAB_0028e776;
        }
        break;
      }
      lVar4 = lVar4 + 0x60;
      lVar6 = lVar6 + -0x30;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  this->fiber_stack = (stack_pointer *)0x0;
  ppVar3 = (proxy *)0x0;
LAB_0028e776:
  this->fiber_stack = (stack_pointer *)ppVar3;
  return (var)(proxy *)this;
}

Assistant:

var get_var_optimizable(T &&name)
		{
			if (m_data.size() == m_set.size()) {
				for (std::size_t i = 0, size = m_data.size(); i < size; ++i) {
					if (m_set[i].count(name) > 0) {
						if (m_data[i].exist(name))
							return m_data[i].get_var_no_check(name);
						else
							break;
					}
				}
			}
			return var();
		}